

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_LibPrintGate(Mio_Cell2_t *pCell,char *pFanins,Mio_Cell2_t *pCell2,char *pFanins2)

{
  int local_2c;
  int k;
  char *pFanins2_local;
  Mio_Cell2_t *pCell2_local;
  char *pFanins_local;
  Mio_Cell2_t *pCell_local;
  
  printf(" %-20s(",pCell->pName);
  for (local_2c = 0; local_2c < (int)(*(uint *)&pCell->field_0x10 >> 0x1c); local_2c = local_2c + 1)
  {
    if (pFanins[local_2c] == '\x10') {
      Sfm_LibPrintGate(pCell2,pFanins2,(Mio_Cell2_t *)0x0,(char *)0x0);
    }
    else {
      printf(" %c",(ulong)((int)pFanins[local_2c] + 0x61));
    }
  }
  printf(" )");
  return;
}

Assistant:

void Sfm_LibPrintGate( Mio_Cell2_t * pCell, char * pFanins, Mio_Cell2_t * pCell2, char * pFanins2 )
{
    int k;
    printf( " %-20s(", pCell->pName );
    for ( k = 0; k < (int)pCell->nFanins; k++ )
        if ( pFanins[k] == (char)16 )
            Sfm_LibPrintGate( pCell2, pFanins2, NULL, NULL );
        else
            printf( " %c", 'a' + pFanins[k] );
    printf( " )" );
}